

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.h
# Opt level: O0

int __thiscall
Fixpp::
StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<'A'>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_1024UL>
::digitsCount(StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_1024UL>
              *this,size_t x)

{
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  size_t x_local;
  StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_1024UL>
  *this_local;
  
  if (x < 10) {
    local_1c = 1;
  }
  else {
    if (x < 100) {
      local_20 = 2;
    }
    else {
      if (x < 1000) {
        local_24 = 3;
      }
      else {
        if (x < 10000) {
          local_28 = 4;
        }
        else {
          if (x < 100000) {
            local_2c = 5;
          }
          else {
            if (x < 1000000) {
              local_30 = 6;
            }
            else {
              if (x < 10000000) {
                local_34 = 7;
              }
              else {
                if (x < 100000000) {
                  local_38 = 8;
                }
                else {
                  local_38 = 10;
                  if (x < 1000000000) {
                    local_38 = 9;
                  }
                }
                local_34 = local_38;
              }
              local_30 = local_34;
            }
            local_2c = local_30;
          }
          local_28 = local_2c;
        }
        local_24 = local_28;
      }
      local_20 = local_24;
    }
    local_1c = local_20;
  }
  return local_1c;
}

Assistant:

int digitsCount(size_t x)
        {  
            return (x < 10 ? 1 :   
                (x < 100 ? 2 :   
                (x < 1000 ? 3 :   
                (x < 10000 ? 4 :   
                (x < 100000 ? 5 :   
                (x < 1000000 ? 6 :   
                (x < 10000000 ? 7 :  
                (x < 100000000 ? 8 :  
                (x < 1000000000 ? 9 :  
                10)))))))));  
        }